

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O2

FourCC __thiscall riffcpp::Chunk::type(Chunk *this)

{
  impl *piVar1;
  FourCC read_type;
  
  piVar1 = this->pimpl;
  std::istream::seekg((piVar1->m_stream).
                      super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(piVar1->m_pos)._M_off + 8,(piVar1->m_pos)._M_state);
  std::istream::read((char *)(this->pimpl->m_stream).
                             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,(long)&read_type);
  return (FourCC)read_type._M_elems;
}

Assistant:

riffcpp::FourCC riffcpp::Chunk::type() {
  std::streamoff offs{8};
  pimpl->m_stream->seekg(pimpl->m_pos + offs);
  riffcpp::FourCC read_type;
  pimpl->m_stream->read(read_type.data(), read_type.size());
  return read_type;
}